

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O1

__pid_t __thiscall kmp_flag_32::wait(kmp_flag_32 *this,void *__stat_loc)

{
  kmp_int32 gtid;
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  void *in_RCX;
  int in_EDX;
  kmp_uint32 kVar4;
  long lVar5;
  int iVar6;
  int tasks_completed;
  uint local_4c;
  int local_44;
  uint *local_40;
  void *local_38;
  
  local_40 = (this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.loc;
  local_44 = 0;
  if (*(this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.loc ==
      *(uint *)&(this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.field_0xc) {
    if (__kmp_itt_prepare_delay < 1 && __kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0) {
LAB_00139d8a:
      _Var2 = (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_40);
      return _Var2;
    }
  }
  else {
    gtid = *(kmp_int32 *)((long)__stat_loc + 0x24);
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      if ((__kmp_zero_bt == 0) || (*(int *)((long)__stat_loc + 0x88) != 0)) {
        iVar6 = *(int *)((long)__stat_loc + 0x84);
      }
      else {
        iVar6 = 0;
      }
      iVar3 = iVar6 + 1;
      if (iVar6 == 0) {
        iVar3 = 0;
      }
      local_4c = iVar3 + __kmp_global._0_4_;
    }
    iVar6 = 0;
    kVar4 = __kmp_yield_init;
    local_38 = in_RCX;
    do {
      if (*(this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.loc ==
          *(uint *)&(this->super_kmp_basic_flag<unsigned_int>).super_kmp_flag<unsigned_int>.
                    field_0xc) break;
      if ((__kmp_tasking_mode == tskm_immediate_exec) ||
         (lVar5 = *(long *)((long)__stat_loc + 0x170), lVar5 == 0)) {
        lVar5 = 0;
      }
      else if (*(int *)(lVar5 + 0xc0) == 0) {
        *(undefined8 *)((long)__stat_loc + 0x170) = 0;
      }
      else if (*(int *)(lVar5 + 0x50) == 1) {
        __kmp_execute_tasks_32((kmp_info_t *)__stat_loc,gtid,this,in_EDX,&local_44,local_38,0);
      }
      if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
        if (iVar6 < __kmp_itt_prepare_delay) {
          iVar6 = iVar6 + 1;
          if (__kmp_itt_prepare_delay <= iVar6) {
            (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(local_40);
          }
        }
      }
      if (__kmp_global.g.g_done == 0) {
        __kmp_yield((uint)(__kmp_avail_proc < __kmp_nth));
        kVar4 = kVar4 - 2;
        if (kVar4 == 0) {
          __kmp_yield(1);
          kVar4 = __kmp_yield_next;
        }
        iVar3 = *(int *)((long)__stat_loc + 0x60);
        if ((*(char *)((long)__stat_loc + 0x198) == '\0') == (iVar3 != 0)) {
          if (iVar3 == 0) {
            LOCK();
            __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + -1;
            UNLOCK();
          }
          else {
            LOCK();
            __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + 1;
            UNLOCK();
          }
          *(bool *)((long)__stat_loc + 0x198) = iVar3 != 0;
        }
        if ((__kmp_dflt_blocktime != 0x7fffffff) &&
           (((lVar5 == 0 || (*(int *)(lVar5 + 0x50) == 0)) && (local_4c <= (uint)__kmp_global._0_4_)
            ))) {
          __kmp_suspend_32(gtid,this);
          if (__kmp_global.g.g_done != 0) goto LAB_00139c79;
        }
        bVar1 = false;
      }
      else {
LAB_00139c79:
        if (__kmp_global.g.g_abort != 0) {
          __kmp_abort_thread();
        }
        bVar1 = true;
      }
    } while (!bVar1);
    if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar6)
    goto LAB_00139d8a;
  }
  return (__pid_t)__kmp_itt_fsync_acquired_ptr__3_0;
}

Assistant:

void wait(kmp_info_t *this_thr, int final_spin
              USE_ITT_BUILD_ARG(void * itt_sync_obj)) {
        __kmp_wait_template(this_thr, this, final_spin
                            USE_ITT_BUILD_ARG(itt_sync_obj));
    }